

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignumber.cpp
# Opt level: O1

BigNumber * __thiscall BigNumber::operator/=(BigNumber *this,longlong *other)

{
  pointer pcVar1;
  long *local_60 [2];
  long local_50 [2];
  BigNumber local_40;
  
  pcVar1 = (this->_numberString)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->_numberString)._M_string_length);
  dividell(&local_40,(BigNumber *)local_60,other);
  std::__cxx11::string::_M_assign((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._numberString._M_dataplus._M_p != &local_40._numberString.field_2) {
    operator_delete(local_40._numberString._M_dataplus._M_p,
                    local_40._numberString.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return this;
}

Assistant:

BigNumber& BigNumber::operator/=(const long long &other) {
    *this = *this / other;
    return *this;
}